

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCheckedActualCall_unExpectedParameterName_Test::testBody
          (TEST_MockCheckedActualCall_unExpectedParameterName_Test *this)

{
  MockExpectedCallsList *pMVar1;
  MockActualCall *this_00;
  UtestShell *test;
  SimpleString local_220;
  undefined1 local_210 [8];
  MockUnexpectedInputParameterFailure expectedFailure;
  undefined1 local_198 [8];
  MockNamedValue parameter;
  SimpleString local_138;
  undefined1 local_128 [8];
  MockCheckedActualCall actualCall;
  SimpleString local_c0;
  undefined1 local_b0 [8];
  MockCheckedExpectedCall call1;
  TEST_MockCheckedActualCall_unExpectedParameterName_Test *this_local;
  
  call1._152_8_ = this;
  MockCheckedExpectedCall::MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b0);
  SimpleString::SimpleString(&local_c0,"func");
  MockCheckedExpectedCall::withName((MockCheckedExpectedCall *)local_b0,&local_c0);
  SimpleString::~SimpleString(&local_c0);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list;
  (*pMVar1->_vptr_MockExpectedCallsList[0xc])(pMVar1,local_b0);
  MockCheckedActualCall::MockCheckedActualCall
            ((MockCheckedActualCall *)local_128,1,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).reporter,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list);
  SimpleString::SimpleString(&local_138,"func");
  this_00 = MockCheckedActualCall::withName((MockCheckedActualCall *)local_128,&local_138);
  SimpleString::SimpleString((SimpleString *)&parameter.copier_,"integer");
  MockActualCall::withParameter(this_00,(SimpleString *)&parameter.copier_,1);
  SimpleString::~SimpleString((SimpleString *)&parameter.copier_);
  SimpleString::~SimpleString(&local_138);
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,"integer");
  MockNamedValue::MockNamedValue
            ((MockNamedValue *)local_198,
             (SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  MockNamedValue::setValue((MockNamedValue *)local_198,1);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_220,"func");
  MockUnexpectedInputParameterFailure::MockUnexpectedInputParameterFailure
            ((MockUnexpectedInputParameterFailure *)local_210,test,&local_220,
             (MockNamedValue *)local_198,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list);
  SimpleString::~SimpleString(&local_220);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_210,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x79);
  MockUnexpectedInputParameterFailure::~MockUnexpectedInputParameterFailure
            ((MockUnexpectedInputParameterFailure *)local_210);
  MockNamedValue::~MockNamedValue((MockNamedValue *)local_198);
  MockCheckedActualCall::~MockCheckedActualCall((MockCheckedActualCall *)local_128);
  MockCheckedExpectedCall::~MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b0);
  return;
}

Assistant:

TEST(MockCheckedActualCall, unExpectedParameterName)
{
    MockCheckedExpectedCall call1;
    call1.withName("func");
    list->addExpectedCall(&call1);

    MockCheckedActualCall actualCall(1, reporter, *list);
    actualCall.withName("func").withParameter("integer", 1);

    MockNamedValue parameter("integer");
    parameter.setValue(1);

    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "func", parameter, *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}